

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementScopedC2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot value2Slot,RegSlot regSlot,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg;
  PropertyId propertyId_00;
  JITTimeFunctionBody *this_00;
  SymOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  Instr *pIVar3;
  Opnd *src2Opnd;
  undefined4 *puVar4;
  Instr *newInstr;
  RegSlot instanceSlot;
  SymOpnd *fieldSymOpnd;
  RegOpnd *value2Opnd;
  RegOpnd *regOpnd;
  PropertyId propertyId;
  Instr *instr;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot regSlot_local;
  RegSlot value2Slot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  reg = GetEnvRegForEvalCode(this);
  if (newOpcode == ScopedLdInst) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(this_00,propertyIdIndex);
    src1Opnd = BuildFieldOpnd(this,ScopedLdInst,reg,propertyId_00,propertyIdIndex,PropertyKindData,
                              0xffffffff);
    dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,false);
    dstOpnd_00 = BuildDstOpnd(this,value2Slot,TyVar,false,false);
    pIVar3 = IR::Instr::New(Unused,&dstOpnd_00->super_Opnd,this->m_func);
    AddInstr(this,pIVar3,offset);
    src2Opnd = IR::Instr::GetDst(pIVar3);
    pIVar3 = IR::Instr::New(ScopedLdInst,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,src2Opnd,
                            this->m_func);
    AddInstr(this,pIVar3,offset);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x1349,"((0))","Unknown ElementC2 opcode");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
IRBuilder::BuildElementScopedC2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot value2Slot,
                                Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr = nullptr;

    Js::PropertyId  propertyId;
    IR::RegOpnd *   regOpnd;
    IR::RegOpnd *   value2Opnd;
    IR::SymOpnd * fieldSymOpnd;

    Js::RegSlot   instanceSlot = this->GetEnvRegForEvalCode();

    switch (newOpcode)
    {
    case Js::OpCode::ScopedLdInst:
        {
            propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instanceSlot, propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = this->BuildDstOpnd(regSlot);
            value2Opnd = this->BuildDstOpnd(value2Slot);

            IR::Instr *newInstr = IR::Instr::New(Js::OpCode::Unused, value2Opnd, m_func);
            this->AddInstr(newInstr, offset);

            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, newInstr->GetDst(), m_func);
            this->AddInstr(instr, offset);
        }
        break;

    default:
        AssertMsg(UNREACHED, "Unknown ElementC2 opcode");
        Fatal();
    }
}